

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O0

int Assimp::FBX::PropertyGet<int>(PropertyTable *in,string *name,int *defaultValue)

{
  Property *this;
  TypedProperty<int> *this_00;
  int *piVar1;
  TypedProperty<int> *tprop;
  Property *prop;
  int *defaultValue_local;
  string *name_local;
  PropertyTable *in_local;
  
  this = PropertyTable::Get(in,name);
  if (this == (Property *)0x0) {
    in_local._4_4_ = *defaultValue;
  }
  else {
    this_00 = Property::As<Assimp::FBX::TypedProperty<int>>(this);
    if (this_00 == (TypedProperty<int> *)0x0) {
      in_local._4_4_ = *defaultValue;
    }
    else {
      piVar1 = TypedProperty<int>::Value(this_00);
      in_local._4_4_ = *piVar1;
    }
  }
  return in_local._4_4_;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, const T& defaultValue) {
    const Property* const prop = in.Get(name);
    if( nullptr == prop) {
        return defaultValue;
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        return defaultValue;
    }

    return tprop->Value();
}